

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

lysc_ext_instance * lyd_get_meta_annotation(lys_module *mod,char *name,size_t name_len)

{
  lyplg_ext *plVar1;
  int iVar2;
  lyplg_ext *local_48;
  lyplg_ext *plugin;
  uint64_t u;
  size_t name_len_local;
  char *name_local;
  lys_module *mod_local;
  
  if (mod == (lys_module *)0x0) {
    return (lysc_ext_instance *)0x0;
  }
  plugin = (lyplg_ext *)0x0;
  while( true ) {
    if (mod->compiled->exts == (lysc_ext_instance *)0x0) {
      local_48 = (lyplg_ext *)0x0;
    }
    else {
      local_48 = (lyplg_ext *)mod->compiled->exts[-1].compiled;
    }
    if (local_48 <= plugin) break;
    plVar1 = (mod->compiled->exts[(long)plugin].def)->plugin;
    if (((plVar1 != (lyplg_ext *)0x0) &&
        (iVar2 = strncmp(plVar1->id,"ly2 metadata",0xc), iVar2 == 0)) &&
       (iVar2 = ly_strncmp(mod->compiled->exts[(long)plugin].argument,name,name_len), iVar2 == 0)) {
      return mod->compiled->exts + (long)plugin;
    }
    plugin = (lyplg_ext *)((long)&plugin->id + 1);
  }
  return (lysc_ext_instance *)0x0;
}

Assistant:

static struct lysc_ext_instance *
lyd_get_meta_annotation(const struct lys_module *mod, const char *name, size_t name_len)
{
    LY_ARRAY_COUNT_TYPE u;
    struct lyplg_ext *plugin;

    if (!mod) {
        return NULL;
    }

    LY_ARRAY_FOR(mod->compiled->exts, u) {
        plugin = mod->compiled->exts[u].def->plugin;
        if (plugin && !strncmp(plugin->id, "ly2 metadata", 12) &&
                !ly_strncmp(mod->compiled->exts[u].argument, name, name_len)) {
            return &mod->compiled->exts[u];
        }
    }

    return NULL;
}